

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_hashmap_node *
HashmapNodeMerge(jx9_hashmap_node *pA,jx9_hashmap_node *pB,ProcNodeCmp xCmp,void *pCmpData)

{
  sxi32 sVar1;
  jx9_hashmap_node *pjVar2;
  jx9_hashmap_node jStack_88;
  
  jStack_88.pNext = (jx9_hashmap_node *)0x0;
  jStack_88.pPrev = (jx9_hashmap_node *)0x0;
  pjVar2 = &jStack_88;
  while ((pA != (jx9_hashmap_node *)0x0 && (pB != (jx9_hashmap_node *)0x0))) {
    sVar1 = (*xCmp)(pA,pB,pCmpData);
    if (sVar1 < 0) {
      pjVar2->pPrev = pA;
      pA->pNext = pjVar2;
      pjVar2 = pA;
      pA = pA->pPrev;
    }
    else {
      pjVar2->pPrev = pB;
      pB->pNext = pjVar2;
      pjVar2 = pB;
      pB = pB->pPrev;
    }
  }
  if (pA == (jx9_hashmap_node *)0x0) {
    if (pB == (jx9_hashmap_node *)0x0) {
      pjVar2->pNext = (jx9_hashmap_node *)0x0;
      pjVar2->pPrev = (jx9_hashmap_node *)0x0;
    }
    else {
      pjVar2->pPrev = pB;
      pB->pNext = pjVar2;
    }
  }
  else {
    pjVar2->pPrev = pA;
    pA->pNext = pjVar2;
  }
  return jStack_88.pPrev;
}

Assistant:

static jx9_hashmap_node * HashmapNodeMerge(jx9_hashmap_node *pA, jx9_hashmap_node *pB, ProcNodeCmp xCmp, void *pCmpData)
{
	jx9_hashmap_node result, *pTail;
    /* Prevent compiler warning */
	result.pNext = result.pPrev = 0;
	pTail = &result;
	while( pA && pB ){
		if( xCmp(pA, pB, pCmpData) < 0 ){
			pTail->pPrev = pA;
			pA->pNext = pTail;
			pTail = pA;
			pA = pA->pPrev;
		}else{
			pTail->pPrev = pB;
			pB->pNext = pTail;
			pTail = pB;
			pB = pB->pPrev;
		}
	}
	if( pA ){
		pTail->pPrev = pA;
		pA->pNext = pTail;
	}else if( pB ){
		pTail->pPrev = pB;
		pB->pNext = pTail;
	}else{
		pTail->pPrev = pTail->pNext = 0;
	}
	return result.pPrev;
}